

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

char16_t * u16tou16(char16_t *source)

{
  size_t sVar1;
  char16_t *s1;
  char16_t *in_RDI;
  char16_t *temp;
  undefined8 local_8;
  
  if (in_RDI == (char16_t *)0x0) {
    g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
    local_8 = (char16_t *)0x0;
  }
  else {
    sVar1 = strlenU16(in_RDI);
    s1 = (char16_t *)malloc(sVar1 * 2 + 1);
    if (s1 == (char16_t *)0x0) {
      g_lastError = OPENJTALKERROR_MALLOC_ERROR;
      local_8 = (char16_t *)0x0;
    }
    else {
      local_8 = strcpyU16(s1,in_RDI);
    }
  }
  return local_8;
}

Assistant:

char16_t *u16tou16(const char16_t *source)
{
	if (source == NULL)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	char16_t *temp = (char16_t *)malloc(strlenU16(source) * sizeof(char16_t) + 1);
	if (!temp)
	{
		g_lastError = OPENJTALKERROR_MALLOC_ERROR;
		return NULL;
	}
	return strcpyU16(temp, source);
}